

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::cleanup::ChunkList::Cleanup(ChunkList *this,SerialArena *arena)

{
  CleanupNode *pCVar1;
  Chunk *pCVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  Chunk *pCVar5;
  CleanupNode *pCVar6;
  CleanupNode *pCVar7;
  SizedPtr mem;
  GetDeallocator deallocator;
  GetDeallocator local_30;
  
  if (this->head_ != (Chunk *)0x0) {
    uVar4 = (arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8;
    if (uVar4 == 0) {
      local_30.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
    }
    else {
      local_30.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar4 + 0x18);
    }
    pCVar7 = this->next_;
    pCVar5 = this->head_;
    while( true ) {
      pCVar7 = pCVar7 + -1;
      pCVar1 = (CleanupNode *)(pCVar5 + 1);
      pCVar6 = pCVar7;
      for (uVar3 = 0; (pCVar1 <= pCVar6 && (uVar3 < 8)); uVar3 = uVar3 + 1) {
        pCVar6 = pCVar6 + -1;
      }
      for (; pCVar1 <= pCVar6; pCVar6 = pCVar6 + -1) {
        (*pCVar7->destructor)((Chunk *)pCVar7->elem);
        pCVar7 = pCVar7 + -1;
      }
      for (; pCVar1 <= pCVar7; pCVar7 = pCVar7 + -1) {
        (*pCVar7->destructor)((Chunk *)pCVar7->elem);
      }
      pCVar2 = pCVar5->next;
      mem.n = pCVar5->size;
      mem.p = pCVar5;
      anon_unknown_12::GetDeallocator::operator()(&local_30,mem);
      if (pCVar2 == (Chunk *)0x0) break;
      pCVar7 = (CleanupNode *)((long)&pCVar2[1].next + (pCVar2->size - 0x10 & 0xfffffffffffffff0));
      pCVar5 = pCVar2;
    }
  }
  return;
}

Assistant:

void ChunkList::Cleanup(const SerialArena& arena) {
  Chunk* c = head_;
  if (c == nullptr) return;
  GetDeallocator deallocator(arena.parent_.AllocPolicy());

  // Iterate backwards in order to destroy in the right order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    // A prefetch distance of 8 here was chosen arbitrarily.
    constexpr int kPrefetchDistance = 8;
    CleanupNode* prefetch = it;
    // Prefetch the first kPrefetchDistance nodes.
    for (int i = 0; prefetch >= first && i < kPrefetchDistance;
         --prefetch, ++i) {
      prefetch->Prefetch();
    }
    // For the middle nodes, run destructor and prefetch the node
    // kPrefetchDistance after the current one.
    for (; prefetch >= first; --it, --prefetch) {
      it->Destroy();
      prefetch->Prefetch();
    }
    // Note: we could consider prefetching `next` chunk earlier.
    absl::PrefetchToLocalCacheNta(c->next);
    // Destroy the rest without prefetching.
    for (; it >= first; --it) {
      it->Destroy();
    }
    Chunk* next = c->next;
    deallocator({c, c->size});
    if (next == nullptr) return;
    c = next;
    it = c->Last();
  };
}